

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsigc++.h
# Opt level: O1

void __thiscall
sigc::signal<void,_int,_void_*>::emit(signal<void,_int,_void_*> *this,int params,void *params_1)

{
  stored_size_type sVar1;
  functor_base<void,_int,_void_*> *pfVar2;
  undefined4 in_register_00000034;
  EVP_PKEY_CTX *ctx;
  long lVar3;
  pointer ppVar4;
  
  ctx = (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,params);
  sVar1 = (this->m_funcs).
          super_small_vector_base<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_void,_void>
          .super_type.m_holder.m_size;
  if (sVar1 != 0) {
    ppVar4 = (this->m_funcs).
             super_small_vector_base<std::pair<boost::intrusive_ptr<sigc::functor_base<void,_int,_void_*>_>,_int>,_void,_void>
             .super_type.m_holder.m_start;
    lVar3 = sVar1 << 4;
    do {
      if (ppVar4 == (pointer)0x0) {
        __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                      "reference boost::container::vec_iterator<std::pair<boost::intrusive_ptr<sigc::functor_base<void, int, void *>>, int> *, false>::operator*() const [Pointer = std::pair<boost::intrusive_ptr<sigc::functor_base<void, int, void *>>, int> *, IsConst = false]"
                     );
      }
      pfVar2 = (ppVar4->first).px;
      if (pfVar2 != (functor_base<void,_int,_void_*> *)0x0) {
        ctx = (EVP_PKEY_CTX *)(ulong)(uint)params;
        (**(code **)((long)(pfVar2->super_functor_refcnt)._vptr_functor_refcnt + 0x10))
                  (pfVar2,ctx,params_1);
      }
      ppVar4 = ppVar4 + 1;
      lVar3 = lVar3 + -0x10;
    } while (lVar3 != 0);
  }
  cleanup(this,ctx);
  return;
}

Assistant:

void emit(PARAM_TYPES... params) {
        for (auto &it : m_funcs) {
            if (it.first) {
                it.first->operator()(params...);
            }
        }

        cleanup();
    }